

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O0

void parallel_runs(uint w)

{
  code *pcVar1;
  bool bVar2;
  byte extraout_AL;
  byte extraout_AL_00;
  undefined8 uVar3;
  __int_type_conflict1 _Var4;
  double __x;
  double __x_00;
  thread *t_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range2_1;
  ResultBuilder DOCTEST_RB_1;
  int t_2;
  atomic<unsigned_long> barrier;
  vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
  taskflows;
  Executor executor_1;
  Subcase *DOCTEST_ANON_SUBCASE_77;
  ResultBuilder DOCTEST_RB;
  thread *t_1;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  int t;
  Executor executor;
  Subcase *DOCTEST_ANON_SUBCASE_76;
  anon_class_8_1_bc7188dc make_taskflow;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<int> counter;
  memory_order __b_1;
  memory_order __b;
  Result *in_stack_fffffffffffff9e8;
  Result *res;
  undefined4 in_stack_fffffffffffff9f0;
  __int_type in_stack_fffffffffffff9f4;
  undefined4 uVar5;
  type *in_stack_fffffffffffff9f8;
  allocator_type *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  Enum in_stack_fffffffffffffa0c;
  ResultBuilder *in_stack_fffffffffffffa10;
  ResultBuilder *this;
  Executor *in_stack_fffffffffffffa20;
  Executor *this_00;
  undefined8 in_stack_fffffffffffffa48;
  int line;
  char *in_stack_fffffffffffffa50;
  String *in_stack_fffffffffffffa58;
  Subcase *in_stack_fffffffffffffa60;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_598;
  Subcase *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  ExpressionDecomposer local_57c;
  Expression_lhs<const_int> local_578;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  int local_4ac;
  undefined1 local_4a8 [15];
  undefined1 local_499 [377];
  Subcase local_320;
  Subcase *local_2f0;
  undefined4 local_2e4;
  undefined4 local_2e0;
  ExpressionDecomposer local_2dc;
  Expression_lhs<const_int> local_2d8;
  ResultBuilder local_2b0;
  reference local_238;
  thread *local_230;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_228;
  undefined1 *local_220;
  undefined4 **local_218;
  undefined1 *local_210;
  int local_204;
  char local_200 [16];
  undefined1 local_1f0 [352];
  Subcase local_90;
  Subcase *local_60;
  undefined4 *local_58;
  undefined1 local_50 [28];
  undefined4 local_34 [3];
  memory_order local_28;
  int local_24;
  allocator_type *local_20;
  memory_order local_10;
  undefined4 local_c;
  undefined4 *local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x125feb);
  local_58 = local_34;
  doctest::String::String((String *)in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
  doctest::detail::Subcase::Subcase
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,line);
  doctest::String::~String((String *)in_stack_fffffffffffffa00);
  local_60 = &local_90;
  bVar2 = doctest::detail::Subcase::operator_cast_to_bool(local_60);
  if (bVar2) {
    uVar3 = 0;
    in_stack_fffffffffffffa50 = local_200;
    std::shared_ptr<tf::WorkerInterface>::shared_ptr
              ((shared_ptr<tf::WorkerInterface> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               in_stack_fffffffffffff9e8);
    tf::Executor::Executor
              ((Executor *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8);
    std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1260af);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4);
    for (local_204 = 0; local_204 < 0x20; local_204 = local_204 + 1) {
      local_218 = &local_58;
      local_210 = local_1f0;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<parallel_runs(unsigned_int)::__1>
                ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffa00,
                 (type *)in_stack_fffffffffffff9f8);
    }
    local_220 = local_50;
    local_228._M_current =
         (thread *)
         std::vector<std::thread,_std::allocator<std::thread>_>::begin
                   ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffff9e8);
    local_230 = (thread *)
                std::vector<std::thread,_std::allocator<std::thread>_>::end
                          ((vector<std::thread,_std::allocator<std::thread>_> *)
                           in_stack_fffffffffffff9e8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                          *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                         (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                          *)in_stack_fffffffffffff9e8);
      line = (int)((ulong)uVar3 >> 0x20);
      if (!bVar2) break;
      local_238 = __gnu_cxx::
                  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                  ::operator*(&local_228);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&local_228);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear
              ((vector<std::thread,_std::allocator<std::thread>_> *)0x126238);
    in_stack_fffffffffffff9e8 = (Result *)0x1ae920;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,(char *)in_stack_fffffffffffffa00
               ,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),"",
               (char *)in_stack_fffffffffffffa20);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_2dc,DT_REQUIRE);
    local_8 = local_34;
    local_c = 5;
    local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_2e0 = local_34[0];
    local_2d8 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)in_stack_fffffffffffff9f8,
                           (int *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    local_2e4 = 0x10000;
    doctest::detail::Expression_lhs<int_const>::operator==
              ((Expression_lhs<const_int> *)
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (int *)in_stack_fffffffffffffa70);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               in_stack_fffffffffffff9e8);
    doctest::detail::Result::~Result((Result *)0x126392);
    doctest::detail::ResultBuilder::log(&local_2b0,__x);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x12645f);
    tf::Executor::~Executor(in_stack_fffffffffffffa20);
  }
  doctest::detail::Subcase::~Subcase(in_stack_fffffffffffffa70);
  doctest::String::String((String *)in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
  doctest::detail::Subcase::Subcase
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,line);
  doctest::String::~String((String *)in_stack_fffffffffffffa00);
  local_2f0 = &local_320;
  bVar2 = doctest::detail::Subcase::operator_cast_to_bool(local_2f0);
  if (bVar2) {
    this_00 = (Executor *)(local_499 + 0x19);
    std::shared_ptr<tf::WorkerInterface>::shared_ptr
              ((shared_ptr<tf::WorkerInterface> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               in_stack_fffffffffffff9e8);
    tf::Executor::Executor
              ((Executor *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8);
    std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x126550);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4);
    this = (ResultBuilder *)local_499;
    std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>::allocator
              ((allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_> *)
               0x126571);
    std::
    vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ::vector((vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
              *)this,CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             in_stack_fffffffffffffa00);
    std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>::~allocator
              ((allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_> *)
               0x126597);
    memset(local_4a8,0,8);
    for (local_4ac = 0; local_4ac < 0x20; local_4ac = local_4ac + 1) {
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<parallel_runs(unsigned_int)::__2>
                ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffa00,
                 in_stack_fffffffffffff9f8);
    }
    do {
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9f8);
    } while (_Var4 != 0x20);
    tf::Executor::wait_for_all(this_00);
    res = (Result *)0x1ae920;
    doctest::detail::ResultBuilder::ResultBuilder
              (this,in_stack_fffffffffffffa0c,(char *)in_stack_fffffffffffffa00,
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),"",
               (char *)this_00);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_57c,DT_REQUIRE);
    in_stack_fffffffffffffa00 = (allocator_type *)local_34;
    local_24 = 5;
    local_20 = in_stack_fffffffffffffa00;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_24 - 1U < 2) {
      local_34[2] = *(undefined4 *)in_stack_fffffffffffffa00;
    }
    else if (local_24 == 5) {
      local_34[2] = *(undefined4 *)in_stack_fffffffffffffa00;
    }
    else {
      local_34[2] = *(undefined4 *)in_stack_fffffffffffffa00;
    }
    local_578 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)in_stack_fffffffffffff9f8,
                           (int *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    doctest::detail::Expression_lhs<int_const>::operator==
              ((Expression_lhs<const_int> *)CONCAT44(0x10000,in_stack_fffffffffffffa78),
               (int *)in_stack_fffffffffffffa70);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),res);
    doctest::detail::Result::~Result((Result *)0x126860);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffab0,__x_00);
    uVar5 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffff9f4);
    if ((extraout_AL_00 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(uVar5,in_stack_fffffffffffff9f0));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x126933);
    in_stack_fffffffffffffa70 = (Subcase *)local_50;
    local_598._M_current =
         (thread *)
         std::vector<std::thread,_std::allocator<std::thread>_>::begin
                   ((vector<std::thread,_std::allocator<std::thread>_> *)res);
    std::vector<std::thread,_std::allocator<std::thread>_>::end
              ((vector<std::thread,_std::allocator<std::thread>_> *)res);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)CONCAT44(uVar5,in_stack_fffffffffffff9f0),
                              (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)res), bVar2) {
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*(&local_598);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&local_598);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear
              ((vector<std::thread,_std::allocator<std::thread>_> *)0x1269cf);
    std::
    vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ::~vector((vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
               *)in_stack_fffffffffffffa00);
    tf::Executor::~Executor(this_00);
  }
  doctest::detail::Subcase::~Subcase(in_stack_fffffffffffffa70);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffa00);
  return;
}

Assistant:

void parallel_runs(unsigned w) {

  std::atomic<int> counter;
  std::vector<std::thread> threads;

  auto make_taskflow = [&] (tf::Taskflow& tf) {
    for(int i=0; i<1024; i++) {
      auto A = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      auto B = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      A.precede(B);
    }
  };

  SUBCASE("RunAndWait") {
    tf::Executor executor(w);
    counter = 0;
    for(int t=0; t<32; t++) {
      threads.emplace_back([&] () {
        tf::Taskflow taskflow;
        make_taskflow(taskflow);
        executor.run(taskflow).wait();
      });
    }

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();

    REQUIRE(counter.load() == 32*1024*2);

  }

  SUBCASE("RunAndWaitForAll") {
    tf::Executor executor(w);
    counter = 0;
    std::vector<std::unique_ptr<tf::Taskflow>> taskflows(32);
    std::atomic<size_t> barrier(0);
    for(int t=0; t<32; t++) {
      threads.emplace_back([&, t=t] () {
        taskflows[t] = std::make_unique<tf::Taskflow>();
        make_taskflow(*taskflows[t]);
        executor.run(*taskflows[t]);
        ++barrier;    // make sure all runs are issued
      });
    }

    while(barrier != 32);
    executor.wait_for_all();
    REQUIRE(counter.load() == 32*1024*2);

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();
  }
}